

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdSetTapScriptByWitnessStack
              (void *handle,void *tree_handle,char *control_block,char *tapscript,
              char **internal_pubkey)

{
  pointer pBVar1;
  bool bVar2;
  reference this;
  char *pcVar3;
  CfdException *pCVar4;
  ByteData256 *node;
  pointer commitment;
  uint8_t leaf_version;
  void *local_188;
  char *work_internal_pubkey;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  SchnorrPubkey internal_pubkey_obj;
  string local_120;
  TaprootScriptTree new_tree;
  Script tapscript_obj;
  
  work_internal_pubkey = (char *)0x0;
  local_188 = handle;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&new_tree,"TapscriptTree",(allocator *)&tapscript_obj);
  cfd::capi::CheckBuffer(tree_handle,(string *)&new_tree);
  std::__cxx11::string::~string((string *)&new_tree);
  bVar2 = cfd::capi::IsEmptyString(control_block);
  if (bVar2) {
    new_tree.super_TapBranch._vptr_TapBranch = (_func_int **)0x5243e9;
    new_tree.super_TapBranch.has_leaf_ = true;
    new_tree.super_TapBranch.leaf_version_ = '\x02';
    new_tree.super_TapBranch._10_2_ = 0;
    new_tree.super_TapBranch.script_._vptr_Script = (_func_int **)anon_var_dwarf_78c6bc;
    cfd::core::logger::warn<>((CfdSourceLocation *)&new_tree,"control_block is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&new_tree,"Failed to parameter. control_block is null or empty.",
               (allocator *)&tapscript_obj);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&new_tree);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(tapscript);
  if (!bVar2) {
    this = std::vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
           ::at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                  **)((long)tree_handle + 0x10),0);
    leaf_version = '\0';
    cfd::core::SchnorrPubkey::SchnorrPubkey(&internal_pubkey_obj);
    nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cfd::core::Script::Script(&tapscript_obj);
    witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&new_tree,tapscript,(allocator *)&local_120);
    std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
    emplace_back<std::__cxx11::string>
              ((vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)&witness_stack,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_tree);
    std::__cxx11::string::~string((string *)&new_tree);
    std::__cxx11::string::string((string *)&new_tree,control_block,(allocator *)&local_120);
    std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
    emplace_back<std::__cxx11::string>
              ((vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)&witness_stack,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_tree);
    std::__cxx11::string::~string((string *)&new_tree);
    cfd::core::TaprootUtil::ParseTaprootSignData
              (&witness_stack,(SchnorrSignature *)0x0,(bool *)0x0,&leaf_version,&internal_pubkey_obj
               ,&nodes,&tapscript_obj,
               (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)0x0,
               (ByteData *)0x0);
    cfd::core::TaprootScriptTree::TaprootScriptTree
              (&new_tree,leaf_version,&tapscript_obj,*(NetType *)((long)tree_handle + 0x20));
    pBVar1 = nodes.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (commitment = nodes.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_start; commitment != pBVar1;
        commitment = commitment + 1) {
      cfd::core::TaprootScriptTree::AddBranch(&new_tree,commitment);
    }
    if (internal_pubkey == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_120,&internal_pubkey_obj);
      pcVar3 = cfd::capi::CreateString(&local_120);
      work_internal_pubkey = pcVar3;
      std::__cxx11::string::~string((string *)&local_120);
    }
    cfd::core::TaprootScriptTree::operator=(this,&new_tree);
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::clear
              (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                ((long)tree_handle + 0x18));
    if (internal_pubkey != (char **)0x0) {
      *internal_pubkey = pcVar3;
    }
    cfd::core::TaprootScriptTree::~TaprootScriptTree(&new_tree);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&witness_stack);
    cfd::core::Script::~Script(&tapscript_obj);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&internal_pubkey_obj);
    return 0;
  }
  new_tree.super_TapBranch._vptr_TapBranch = (_func_int **)0x5243e9;
  new_tree.super_TapBranch.has_leaf_ = true;
  new_tree.super_TapBranch.leaf_version_ = '\x02';
  new_tree.super_TapBranch._10_2_ = 0;
  new_tree.super_TapBranch.script_._vptr_Script = (_func_int **)anon_var_dwarf_78c6bc;
  cfd::core::logger::warn<>((CfdSourceLocation *)&new_tree,"tapscript is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&new_tree,"Failed to parameter. tapscript is null or empty.",
             (allocator *)&tapscript_obj);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&new_tree);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSetTapScriptByWitnessStack(
    void* handle, void* tree_handle, const char* control_block,
    const char* tapscript, char** internal_pubkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_internal_pubkey = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (IsEmptyString(control_block)) {
      warn(CFD_LOG_SOURCE, "control_block is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. control_block is null or empty.");
    }
    if (IsEmptyString(tapscript)) {
      warn(CFD_LOG_SOURCE, "tapscript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tapscript is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    auto& tree = buffer->tree_buffer->at(0);

    uint8_t leaf_version = 0;
    SchnorrPubkey internal_pubkey_obj;
    std::vector<ByteData256> nodes;
    Script tapscript_obj;
    std::vector<ByteData> witness_stack;
    witness_stack.emplace_back(std::string(tapscript));
    witness_stack.emplace_back(std::string(control_block));
    TaprootUtil::ParseTaprootSignData(
        witness_stack, nullptr, nullptr, &leaf_version, &internal_pubkey_obj,
        &nodes, &tapscript_obj);
    TaprootScriptTree new_tree(leaf_version, tapscript_obj, buffer->net_type);
    for (const auto& node : nodes) new_tree.AddBranch(node);

    if (internal_pubkey != nullptr) {
      work_internal_pubkey = CreateString(internal_pubkey_obj.GetHex());
    }

    tree = new_tree;
    buffer->branch_buffer->clear();
    if (internal_pubkey != nullptr) *internal_pubkey = work_internal_pubkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_internal_pubkey);
  return result;
}